

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

char16_t * __thiscall QtPrivate::qustrchr(QtPrivate *this,QStringView str,char16_t c)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  QtPrivate *pQVar4;
  undefined6 in_register_0000000a;
  ulong uVar5;
  QtPrivate *pQVar6;
  long in_FS_OFFSET;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined2 local_a;
  long local_8;
  
  uVar5 = CONCAT62(in_register_0000000a,c);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a = (undefined2)str.m_size;
  iVar3 = (int)str.m_size * 0x10001;
  pQVar6 = this;
  do {
    pQVar4 = pQVar6 + 0x10;
    if (this + (long)str.m_data * 2 < pQVar4) {
      pQVar4 = (QtPrivate *)
               std::__find_if<char16_t_const*,__gnu_cxx::__ops::_Iter_equals_val<char16_t_const>>
                         (pQVar6,this + (long)str.m_data * 2,&local_a,uVar5);
      goto LAB_0014b8b8;
    }
    sVar7 = (short)iVar3;
    auVar9._0_2_ = -(ushort)(*(short *)pQVar6 == sVar7);
    sVar8 = (short)((uint)iVar3 >> 0x10);
    auVar9._2_2_ = -(ushort)(*(short *)(pQVar6 + 2) == sVar8);
    auVar9._4_2_ = -(ushort)(*(short *)(pQVar6 + 4) == sVar7);
    auVar9._6_2_ = -(ushort)(*(short *)(pQVar6 + 6) == sVar8);
    auVar9._8_2_ = -(ushort)(*(short *)(pQVar6 + 8) == sVar7);
    auVar9._10_2_ = -(ushort)(*(short *)(pQVar6 + 10) == sVar8);
    auVar9._12_2_ = -(ushort)(*(short *)(pQVar6 + 0xc) == sVar7);
    auVar9._14_2_ = -(ushort)(*(short *)(pQVar6 + 0xe) == sVar8);
    uVar2 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
            (ushort)((byte)(auVar9._14_2_ >> 7) & 1) << 0xe | auVar9._14_2_ & 0x8000;
    uVar5 = (ulong)uVar2;
    pQVar6 = pQVar4;
  } while (uVar2 == 0);
  uVar1 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  pQVar4 = pQVar4 + ((ulong)(uVar1 & 0x1e) - 0x10);
LAB_0014b8b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (char16_t *)pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
const char16_t *QtPrivate::qustrchr(QStringView str, char16_t c) noexcept
{
    const char16_t *n = str.utf16();
    const char16_t *e = n + str.size();

#ifdef __SSE2__
    bool loops = true;
    // Using the PMOVMSKB instruction, we get two bits for each character
    // we compare.
    __m128i mch;
    if constexpr (UseAvx2) {
        // we're going to read n[0..15] (32 bytes)
        __m256i mch256 = _mm256_set1_epi32(c | (c << 16));
        for (const char16_t *next = n + 16; next <= e; n = next, next += 16) {
            __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(n));
            __m256i result = _mm256_cmpeq_epi16(data, mch256);
            uint mask = uint(_mm256_movemask_epi8(result));
            if (mask) {
                uint idx = qCountTrailingZeroBits(mask);
                return n + idx / 2;
            }
        }
        loops = false;
        mch = _mm256_castsi256_si128(mch256);
    } else {
        mch = _mm_set1_epi32(c | (c << 16));
    }

    auto hasMatch = [mch, &n](__m128i data, ushort validityMask) {
        __m128i result = _mm_cmpeq_epi16(data, mch);
        uint mask = uint(_mm_movemask_epi8(result));
        if ((mask & validityMask) == 0)
            return false;
        uint idx = qCountTrailingZeroBits(mask);
        n += idx / 2;
        return true;
    };

    // we're going to read n[0..7] (16 bytes)
    for (const char16_t *next = n + 8; next <= e; n = next, next += 8) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(n));
        if (hasMatch(data, 0xffff))
            return n;

        if (!loops) {
            n += 8;
            break;
        }
    }

#  if !defined(__OPTIMIZE_SIZE__)
    // we're going to read n[0..3] (8 bytes)
    if (e - n > 3) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(n));
        if (hasMatch(data, 0xff))
            return n;

        n += 4;
    }

    return UnrollTailLoop<3>::exec(e - n, e,
                                   [=](qsizetype i) { return n[i] == c; },
                                   [=](qsizetype i) { return n + i; });
#  endif
#elif defined(__ARM_NEON__)
    const uint16x8_t vmask = qvsetq_n_u16(1, 1 << 1, 1 << 2, 1 << 3, 1 << 4, 1 << 5, 1 << 6, 1 << 7);
    const uint16x8_t ch_vec = vdupq_n_u16(c);
    for (const char16_t *next = n + 8; next <= e; n = next, next += 8) {
        uint16x8_t data = vld1q_u16(reinterpret_cast<const uint16_t *>(n));
        uint mask = vaddvq_u16(vandq_u16(vceqq_u16(data, ch_vec), vmask));
        if (ushort(mask)) {
            // found a match
            return n + qCountTrailingZeroBits(mask);
        }
    }
#endif // aarch64

    return std::find(n, e, c);
}